

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

void fiobj_str_resize(FIOBJ str,size_t size)

{
  fio_str_s_conflict *s;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  fio_str_info_s fStack_28;
  
  if (((uint)str & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                  ,0xdd,"void fiobj_str_resize(FIOBJ, size_t)");
  }
  uVar3 = str & 0xfffffffffffffff8;
  if (*(char *)(uVar3 + 0x11) != '\0') goto LAB_00143cfb;
  s = (fio_str_s_conflict *)(uVar3 + 0x10);
  if ((s->small == '\0') && (*(long *)(uVar3 + 0x38) != 0)) {
    uVar1 = *(ulong *)(uVar3 + 0x20);
    if (uVar1 <= size) {
      if (*(long *)(uVar3 + 0x30) == 0) {
        uVar1 = *(ulong *)(uVar3 + 0x28);
      }
      *(ulong *)(uVar3 + 0x28) = uVar1;
      goto LAB_00143ce3;
    }
LAB_00143cee:
    *(size_t *)(uVar3 + 0x28) = size;
    lVar2 = *(long *)(uVar3 + 0x38);
  }
  else {
    if (0x2d < size) {
      s->small = '[';
LAB_00143ce3:
      fio_str_capa_assert(&fStack_28,s,size);
      goto LAB_00143cee;
    }
    *(char *)(uVar3 + 0x10) = (char)size * '\x02' + '\x01';
    lVar2 = uVar3 + 0x12;
  }
  *(undefined1 *)(lVar2 + size) = 0;
LAB_00143cfb:
  *(undefined8 *)(uVar3 + 8) = 0;
  return;
}

Assistant:

void fiobj_str_resize(FIOBJ str, size_t size) {
  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  fio_str_resize(&obj2str(str)->str, size);
  obj2str(str)->hash = 0;
  return;
}